

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

void __thiscall iutest::detail::IParamTestInfoData::~IParamTestInfoData(IParamTestInfoData *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

explicit IParamTestInfoData(const char* name) : m_name(name) {}